

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchAI.cpp
# Opt level: O3

void __thiscall
tiger::trains::ai::SwitchAI::SwitchAI
          (SwitchAI *this,World *world,
          vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
          *trainAIList)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  iterator iVar3;
  GoodType GVar4;
  pointer ppTVar5;
  TrainAI *bot;
  TrainAI *local_48;
  pointer *local_40;
  World *local_38;
  
  (this->super_ISubBot)._vptr_ISubBot = (_func_int **)&PTR__SwitchAI_00182f80;
  (this->armorBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->armorBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->armorBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->productBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->productBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->productBots).
  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppTVar5 = (trainAIList->
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (trainAIList->
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = world;
  if (ppTVar5 != ppTVar2) {
    local_40 = &(this->armorBots).
                super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_48 = *ppTVar5;
      GVar4 = TrainAI::getType(local_48);
      if (GVar4 == ARMOR) {
        iVar3._M_current =
             (this->armorBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->armorBots).
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>::
          _M_realloc_insert<tiger::trains::ai::TrainAI*const&>
                    ((vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>
                      *)&this->armorBots,iVar3,&local_48);
        }
        else {
          *iVar3._M_current = local_48;
          pppTVar1 = &(this->armorBots).
                      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
      GVar4 = TrainAI::getType(local_48);
      if (GVar4 == PRODUCT) {
        iVar3._M_current =
             (this->productBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->productBots).
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>::
          _M_realloc_insert<tiger::trains::ai::TrainAI*const&>
                    ((vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>
                      *)&this->productBots,iVar3,&local_48);
        }
        else {
          *iVar3._M_current = local_48;
          pppTVar1 = &(this->productBots).
                      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
      ppTVar5 = ppTVar5 + 1;
    } while (ppTVar5 != ppTVar2);
  }
  this->world = local_38;
  return;
}

Assistant:

SwitchAI::SwitchAI(const world::World *world, const std::vector<TrainAI *> &trainAIList)
{
    for (TrainAI *bot : trainAIList)
    {
        if (bot->getType() == models::GoodType::ARMOR)
            armorBots.push_back(bot);

        if (bot->getType() == models::GoodType::PRODUCT)
            productBots.push_back(bot);
    }

    this->world = world;
}